

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O2

void __thiscall soplex::SVSetBase<double>::memRemax(SVSetBase<double> *this,int newmax)

{
  DLPSV *pDVar1;
  DLPSV *pDVar2;
  ptrdiff_t pVar3;
  int iVar4;
  DLPSV *pDVar5;
  
  pVar3 = ClassArray<soplex::Nonzero<double>_>::reMax
                    (&this->super_ClassArray<soplex::Nonzero<double>_>,newmax,-1);
  if (pVar3 != 0) {
    pDVar1 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_last;
    iVar4 = 0;
    pDVar2 = (this->list).super_IsList<soplex::SVSetBase<double>::DLPSV>.the_first;
    while (pDVar5 = pDVar2, pDVar5 != (DLPSV *)0x0) {
      (pDVar5->super_SVectorBase<double>).m_elem =
           (Nonzero<double> *)((long)&((pDVar5->super_SVectorBase<double>).m_elem)->val + pVar3);
      iVar4 = iVar4 + (pDVar5->super_SVectorBase<double>).memused;
      pDVar2 = (DLPSV *)0x0;
      if (pDVar1 != pDVar5) {
        pDVar2 = pDVar5->thenext;
      }
    }
    this->unusedMem = (this->super_ClassArray<soplex::Nonzero<double>_>).thesize - iVar4;
    this->numUnusedMemUpdates = 0;
  }
  return;
}

Assistant:

void memRemax(int newmax)
   {
      ptrdiff_t delta = SVSetBaseArray::reMax(newmax);

      if(delta != 0)
      {
#ifdef SOPLEX_DEBUG
         SPxOut::debug(this,
                       "counting unused memory (unusedMem = {}, numUnusedMemUpdates = {}, this = {})\n",
                       unusedMem, numUnusedMemUpdates, (void*)this);
#endif

         int used = 0;

         for(DLPSV* ps = list.first(); ps; ps = list.next(ps))
         {
            // get new shifted nonzero memory of the SVectorBase
            Nonzero<R>* newmem = reinterpret_cast<Nonzero<R>*>(reinterpret_cast<char*>(ps->mem()) + delta);

            // get the size and maximum capacity of the SVectorBase
            int sz = ps->size();
            int l_max = ps->max();
            assert(l_max >= sz);

            // set new nonzero memory
            ps->setMem(l_max, newmem);
            ps->set_size(sz);

            // count used memory
            used += sz;
         }

         // update estimation of unused memory to exact value
         unusedMem = memSize() - used;
         numUnusedMemUpdates = 0;

#ifdef SOPLEX_DEBUG
         SPxOut::debug(this, "               --> NEW: unusedMem = {}, after memRemax({})\n", unusedMem,
                       newmax);
#endif
      }
   }